

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

void xmlRegisterDefaultInputCallbacks(void)

{
  long lVar1;
  
  xmlInitParser();
  lVar1 = (long)xmlInputCallbackNr;
  if (lVar1 < 10) {
    xmlInputCallbackTable[lVar1].matchcallback = xmlIODefaultMatch;
    xmlInputCallbackNr = xmlInputCallbackNr + 1;
    xmlInputCallbackTable[lVar1].opencallback = (xmlInputOpenCallback)0x0;
    xmlInputCallbackTable[lVar1].readcallback = (xmlInputReadCallback)0x0;
    xmlInputCallbackTable[lVar1].closecallback = (xmlInputCloseCallback)0x0;
  }
  return;
}

Assistant:

void
xmlRegisterDefaultInputCallbacks(void) {
    xmlRegisterInputCallbacks(xmlIODefaultMatch, NULL, NULL, NULL);
}